

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpege_api_v2.c
# Opt level: O1

MPP_RET jpege_proc_prep_cfg(MppEncPrepCfg *dst,MppEncPrepCfg *src)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  MppEncRotationCfg MVar4;
  long lVar5;
  long lVar6;
  MPP_RET MVar7;
  MppEncPrepCfg bak;
  
  uVar1 = src->change;
  if (uVar1 == 0) {
    _mpp_log_l(2,"jpege_api_v2","Assertion %s failed at %s:%d\n",(char *)0x0,"change",
               "jpege_proc_prep_cfg",0x76);
    if ((mpp_debug._3_1_ & 0x10) == 0) {
      return MPP_OK;
    }
    abort();
  }
  memcpy(&bak,dst,0x84);
  if ((uVar1 & 4) != 0) {
    dst->format = src->format;
    dst->format_out = src->format_out;
    dst->fix_chroma_en = src->fix_chroma_en;
    dst->fix_chroma_u = src->fix_chroma_u;
    dst->fix_chroma_v = src->fix_chroma_v;
    dst->chroma_ds_mode = src->chroma_ds_mode;
  }
  if ((uVar1 >> 0x10 & 1) != 0) {
    dst->range = src->range;
    dst->range_out = src->range_out;
  }
  if ((uVar1 & 0x10) != 0) {
    dst->rotation_ext = src->rotation_ext;
  }
  if ((uVar1 & 0x20) != 0) {
    dst->mirroring_ext = src->mirroring_ext;
  }
  if ((uVar1 & 0x40) != 0) {
    dst->flip = src->flip;
  }
  if (((MPP_ENC_ROT_270 < dst->rotation_ext) || (dst->mirroring_ext < 0)) ||
     (MVar7 = MPP_OK, dst->flip < 0)) {
    _mpp_log_l(2,"jpege_api_v2","invalid trans: rotation %d, mirroring %d\n",(char *)0x0,
               (ulong)dst->rotation_ext,(ulong)(uint)dst->mirroring_ext);
    MVar7 = MPP_ERR_VALUE;
  }
  MVar4 = dst->rotation_ext & MPP_ENC_ROT_270 ^ MPP_ENC_ROT_180;
  uVar3 = (uint)(dst->mirroring_ext == 0);
  if (dst->flip == 0) {
    MVar4 = dst->rotation_ext;
    uVar3 = dst->mirroring_ext;
  }
  dst->mirroring = uVar3;
  dst->rotation = MVar4;
  if ((uVar1 & 0x11) != 0) {
    if ((MVar4 | MPP_ENC_ROT_180) == MPP_ENC_ROT_270) {
      lVar5 = 4;
      lVar6 = 8;
    }
    else {
      lVar5 = 8;
      lVar6 = 4;
    }
    dst->width = *(RK_S32 *)((long)(src->sharpen).coef + lVar6 + -0x68);
    dst->height = *(RK_S32 *)((long)(src->sharpen).coef + lVar5 + -0x68);
    dst->hor_stride = src->hor_stride;
    dst->ver_stride = src->ver_stride;
  }
  if (dst->width - 0x2001U < 0xffffe00f) {
    _mpp_log_l(2,"jpege_api_v2","invalid width %d is not in range [16..8192]\n",
               "jpege_proc_prep_cfg");
    MVar7 = MPP_NOK;
  }
  if (dst->height - 0x2001U < 0xffffe00f) {
    _mpp_log_l(2,"jpege_api_v2","invalid height %d is not in range [16..8192]\n",
               "jpege_proc_prep_cfg");
    MVar7 = MPP_NOK;
  }
  dst->change = dst->change | uVar1;
  if ((dst->rotation | MPP_ENC_ROT_180) == MPP_ENC_ROT_270) {
    uVar2 = dst->height;
    uVar1 = dst->hor_stride;
    if (((int)uVar2 <= (int)uVar1) && (dst->width <= dst->ver_stride)) goto LAB_001c9cdf;
    uVar3 = dst->width;
  }
  else {
    uVar3 = dst->width;
    uVar1 = dst->hor_stride;
    if (((int)uVar3 <= (int)uVar1) && (dst->height <= dst->ver_stride)) goto LAB_001c9cdf;
    uVar2 = dst->height;
  }
  _mpp_log_l(2,"jpege_api_v2","invalid size w:h [%d:%d] stride [%d:%d]\n",(char *)0x0,(ulong)uVar3,
             (ulong)uVar2,(ulong)uVar1,(ulong)(uint)dst->ver_stride);
  MVar7 = MPP_ERR_VALUE;
LAB_001c9cdf:
  if (MVar7 == MPP_OK) {
    if (((byte)jpege_debug & 0x40) != 0) {
      _mpp_log_l(4,"jpege_api_v2","MPP_ENC_SET_PREP_CFG w:h [%d:%d] stride [%d:%d]\n",(char *)0x0,
                 (ulong)(uint)dst->width,(ulong)(uint)dst->height,(ulong)(uint)dst->hor_stride,
                 (ulong)(uint)dst->ver_stride);
    }
  }
  else {
    _mpp_log_l(2,"jpege_api_v2","failed to accept new prep config\n","jpege_proc_prep_cfg");
    memcpy(dst,&bak,0x84);
  }
  return MVar7;
}

Assistant:

static MPP_RET jpege_proc_prep_cfg(MppEncPrepCfg *dst, MppEncPrepCfg *src)
{
    MPP_RET ret = MPP_OK;
    RK_U32 change = src->change;

    mpp_assert(change);
    if (change) {
        MppEncPrepCfg bak = *dst;
        RK_S32 mirroring;
        RK_S32 rotation;

        if (change & MPP_ENC_PREP_CFG_CHANGE_FORMAT) {
            dst->format = src->format;
            dst->format_out = src->format_out;
            dst->fix_chroma_en = src->fix_chroma_en;
            dst->fix_chroma_u = src->fix_chroma_u;
            dst->fix_chroma_v = src->fix_chroma_v;
            dst->chroma_ds_mode = src->chroma_ds_mode;
        }

        if (change & MPP_ENC_PREP_CFG_CHANGE_COLOR_RANGE) {
            dst->range = src->range;
            dst->range_out = src->range_out;
        }

        if (change & MPP_ENC_PREP_CFG_CHANGE_ROTATION)
            dst->rotation_ext = src->rotation_ext;

        if (change & MPP_ENC_PREP_CFG_CHANGE_MIRRORING)
            dst->mirroring_ext = src->mirroring_ext;

        if (change & MPP_ENC_PREP_CFG_CHANGE_FLIP)
            dst->flip = src->flip;

        // parameter checking
        if (dst->rotation_ext >= MPP_ENC_ROT_BUTT || dst->rotation_ext < 0 ||
            dst->mirroring_ext < 0 || dst->flip < 0) {
            mpp_err("invalid trans: rotation %d, mirroring %d\n", dst->rotation_ext, dst->mirroring_ext);
            ret = MPP_ERR_VALUE;
        }

        rotation = dst->rotation_ext;
        mirroring = dst->mirroring_ext;

        if (dst->flip) {
            mirroring = !mirroring;
            rotation += MPP_ENC_ROT_180;
            rotation &= MPP_ENC_ROT_270;
        }

        dst->mirroring = mirroring;
        dst->rotation = rotation;

        /* jpeg encoder do not have denoise/sharpen feature */

        if ((change & MPP_ENC_PREP_CFG_CHANGE_INPUT) ||
            (change & MPP_ENC_PREP_CFG_CHANGE_ROTATION)) {
            if (dst->rotation == MPP_ENC_ROT_90 || dst->rotation == MPP_ENC_ROT_270) {
                dst->width = src->height;
                dst->height = src->width;
            } else {
                dst->width = src->width;
                dst->height = src->height;
            }
            dst->hor_stride = src->hor_stride;
            dst->ver_stride = src->ver_stride;
        }

        if (dst->width < 16 || dst->width > 8192) {
            mpp_err_f("invalid width %d is not in range [16..8192]\n", dst->width);
            ret = MPP_NOK;
        }

        if (dst->height < 16 || dst->height > 8192) {
            mpp_err_f("invalid height %d is not in range [16..8192]\n", dst->height);
            ret = MPP_NOK;
        }

        dst->change |= change;

        // parameter checking
        if (dst->rotation == MPP_ENC_ROT_90 || dst->rotation == MPP_ENC_ROT_270) {
            if (dst->height > dst->hor_stride || dst->width > dst->ver_stride) {
                mpp_err("invalid size w:h [%d:%d] stride [%d:%d]\n",
                        dst->width, dst->height, dst->hor_stride, dst->ver_stride);
                ret = MPP_ERR_VALUE;
            }
        } else {
            if (dst->width > dst->hor_stride || dst->height > dst->ver_stride) {
                mpp_err("invalid size w:h [%d:%d] stride [%d:%d]\n",
                        dst->width, dst->height, dst->hor_stride, dst->ver_stride);
                ret = MPP_ERR_VALUE;
            }
        }

        if (ret) {
            mpp_err_f("failed to accept new prep config\n");
            *dst = bak;
        } else {
            jpege_dbg_ctrl("MPP_ENC_SET_PREP_CFG w:h [%d:%d] stride [%d:%d]\n",
                           dst->width, dst->height,
                           dst->hor_stride, dst->ver_stride);
        }
    }

    return ret;
}